

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cpp
# Opt level: O2

void spvInstructionCopy(uint32_t *words,Op opcode,uint16_t wordCount,spv_endianness_t endian,
                       spv_instruction_t *pInst)

{
  Op OVar1;
  undefined6 in_register_00000012;
  ulong __new_size;
  ulong uVar2;
  
  pInst->opcode = opcode;
  __new_size = CONCAT62(in_register_00000012,wordCount) & 0xffffffff;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&pInst->words,__new_size);
  uVar2 = 0;
  while( true ) {
    if (__new_size == uVar2) {
      return;
    }
    OVar1 = spvFixWord(words[uVar2],endian);
    (pInst->words).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[uVar2] = OVar1;
    if ((uVar2 == 0) && (((OVar1 & 0xffff) != opcode || ((uint16_t)(OVar1 >> 0x10) != wordCount))))
    break;
    uVar2 = uVar2 + 1;
  }
  __assert_fail("opcode == static_cast<spv::Op>(thisOpcode) && wordCount == thisWordCount && \"Endianness failed!\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/opcode.cpp"
                ,0xca,
                "void spvInstructionCopy(const uint32_t *, const spv::Op, const uint16_t, const spv_endianness_t, spv_instruction_t *)"
               );
}

Assistant:

void spvInstructionCopy(const uint32_t* words, const spv::Op opcode,
                        const uint16_t wordCount, const spv_endianness_t endian,
                        spv_instruction_t* pInst) {
  pInst->opcode = opcode;
  pInst->words.resize(wordCount);
  for (uint16_t wordIndex = 0; wordIndex < wordCount; ++wordIndex) {
    pInst->words[wordIndex] = spvFixWord(words[wordIndex], endian);
    if (!wordIndex) {
      uint16_t thisWordCount;
      uint16_t thisOpcode;
      spvOpcodeSplit(pInst->words[wordIndex], &thisWordCount, &thisOpcode);
      assert(opcode == static_cast<spv::Op>(thisOpcode) &&
             wordCount == thisWordCount && "Endianness failed!");
    }
  }
}